

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O2

task_handle __thiscall
oqpi::scheduler<concurrent_queue>::waitForNextTask(scheduler<concurrent_queue> *this,worker_base *w)

{
  char cVar1;
  bool bVar2;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  task_handle tVar3;
  anon_class_16_2_fd512de4 pumpTask;
  anon_class_16_2_fd512de4 local_28;
  
  local_28.this = (scheduler<concurrent_queue> *)w;
  do {
    cVar1 = (**(code **)(*in_RDX + 0x30))();
  } while (cVar1 != '\0');
  (this->workers_).
  super__Vector_base<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>,_std::allocator<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->workers_).
  super__Vector_base<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>,_std::allocator<std::unique_ptr<oqpi::worker_base,_std::default_delete<oqpi::worker_base>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while (bVar2 = waitForNextTask::anon_class_16_2_fd512de4::operator()
                           (&local_28,(task_handle *)this), !bVar2) {
    (**(code **)(*in_RDX + 0x28))();
    do {
      cVar1 = (**(code **)(*in_RDX + 0x30))();
    } while (cVar1 != '\0');
  }
  tVar3.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  tVar3.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (task_handle)tVar3.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

task_handle waitForNextTask(worker_base &w)
        {
            const auto pumpTask = [this, &w](task_handle &hTask)
            {
                if (!running_.load())
                {
                    return true;
                }

                for (auto prio = 0; prio < PRIO_COUNT; ++prio)
                {
                    if (w.canWorkOnPriority(task_priority(prio)))
                    {
                        while (pendingTasks_[prio].tryPop(hTask))
                        {
                            // We got a task, try to grab it to ensure that we can work on it
                            // Note that a task_group can be done without being grabbed when calling activeWait
                            if (hTask.tryGrab() && !hTask.isDone())
                            {
                                // We got the go to start working on the current task
                                return true;
                            }
                            else
                            {
                                // The task has already been grabbed by someone else
                                hTask.reset();
                            }
                        }
                    }
                }

                return false;
            };

            // Before checking if we have a task decrement the semaphore count until it reaches 0
            while (w.tryWait());

            task_handle hTask;
            while (!pumpTask(hTask))
            {
                w.wait();
                while (w.tryWait());
            }

            return hTask;
        }